

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_PNG_Image.cxx
# Opt level: O0

void __thiscall
Fl_PNG_Image::load_png_(Fl_PNG_Image *this,char *name_png,uchar *buffer_png,int maxsize)

{
  undefined1 auVar1 [16];
  uchar *puVar2;
  png_infop ppVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  __jmp_buf_tag *p_Var9;
  size_t sVar10;
  uchar *puVar11;
  ulong uVar12;
  Fl_Shared_Image *this_00;
  uchar *local_a8;
  Fl_Shared_Image *si;
  uchar *puStack_78;
  int num_trans;
  char *display_name;
  png_infop ppStack_68;
  int from_memory;
  fl_png_memory png_mem_data;
  png_bytep *rows;
  png_infop info;
  png_structp pp;
  FILE *pFStack_30;
  int channels;
  FILE *fp;
  int i;
  int maxsize_local;
  uchar *buffer_png_local;
  char *name_png_local;
  Fl_PNG_Image *this_local;
  
  pFStack_30 = (FILE *)0x0;
  rows = (png_bytep *)0x0;
  display_name._4_4_ = (uint)(buffer_png != (uchar *)0x0);
  fp._4_4_ = maxsize;
  _i = (png_structp)buffer_png;
  buffer_png_local = (uchar *)name_png;
  name_png_local = (char *)this;
  if ((display_name._4_4_ == 0) &&
     (pFStack_30 = (FILE *)fl_fopen(name_png,"rb"), pFStack_30 == (FILE *)0x0)) {
    Fl_Image::ld((Fl_Image *)this,-2);
  }
  else {
    if (buffer_png_local == (uchar *)0x0) {
      local_a8 = "In-memory PNG data";
    }
    else {
      local_a8 = buffer_png_local;
    }
    puStack_78 = local_a8;
    info = (png_infop)png_create_read_struct("1.6.37",0,0);
    if (info != (png_infop)0x0) {
      rows = (png_bytep *)png_create_info_struct(info);
    }
    if ((info == (png_infop)0x0) || (rows == (png_bytep *)0x0)) {
      if (info != (png_infop)0x0) {
        png_destroy_read_struct(&info,0);
      }
      if (display_name._4_4_ == 0) {
        fclose(pFStack_30);
      }
      (*Fl::warning)("Cannot allocate memory to read PNG file or data \"%s\".\n");
      Fl_Image::w((Fl_Image *)this,0);
      Fl_Image::h((Fl_Image *)this,0);
      Fl_Image::d((Fl_Image *)this,0);
      Fl_Image::ld((Fl_Image *)this,-3);
    }
    else {
      p_Var9 = (__jmp_buf_tag *)png_set_longjmp_fn(info,longjmp,200);
      iVar6 = _setjmp(p_Var9);
      if (iVar6 == 0) {
        if (display_name._4_4_ == 0) {
          png_init_io(info,pFStack_30);
        }
        else {
          png_mem_data.pp = _i;
          png_mem_data.current = (uchar *)(_i + fp._4_4_);
          ppStack_68 = info;
          png_set_read_fn(info,&stack0xffffffffffffff98,png_read_data_from_mem);
        }
        png_read_info(info,rows);
        cVar4 = png_get_color_type(info,rows);
        if (cVar4 == '\x03') {
          png_set_expand(info);
        }
        bVar5 = png_get_color_type(info,rows);
        if ((bVar5 & 2) == 0) {
          pp._4_4_ = 1;
        }
        else {
          pp._4_4_ = 3;
        }
        si._4_4_ = 0;
        png_get_tRNS(info,rows,0,(long)&si + 4);
        bVar5 = png_get_color_type(info,rows);
        if (((bVar5 & 4) != 0) || (si._4_4_ != 0)) {
          pp._4_4_ = pp._4_4_ + 1;
        }
        iVar6 = png_get_image_width(info,rows);
        Fl_Image::w((Fl_Image *)this,iVar6);
        iVar6 = png_get_image_height(info,rows);
        Fl_Image::h((Fl_Image *)this,iVar6);
        Fl_Image::d((Fl_Image *)this,pp._4_4_);
        bVar5 = png_get_bit_depth(info,rows);
        if (bVar5 < 8) {
          png_set_packing(info);
          png_set_expand(info);
        }
        else {
          cVar4 = png_get_bit_depth(info,rows);
          if (cVar4 == '\x10') {
            png_set_strip_16(info);
          }
        }
        iVar6 = png_get_valid(info,rows,0x10);
        if (iVar6 != 0) {
          png_set_tRNS_to_alpha(info);
        }
        iVar6 = Fl_Image::w((Fl_Image *)this);
        iVar7 = Fl_Image::h((Fl_Image *)this);
        iVar8 = Fl_Image::d((Fl_Image *)this);
        sVar10 = Fl_RGB_Image::max_size();
        if (sVar10 < (ulong)((long)iVar6 * (long)iVar7 * (long)iVar8)) {
          p_Var9 = (__jmp_buf_tag *)png_set_longjmp_fn(info,longjmp,200);
          longjmp(p_Var9,1);
        }
        iVar6 = Fl_Image::w((Fl_Image *)this);
        iVar7 = Fl_Image::h((Fl_Image *)this);
        iVar8 = Fl_Image::d((Fl_Image *)this);
        puVar11 = (uchar *)operator_new__((long)(iVar6 * iVar7 * iVar8));
        (this->super_Fl_RGB_Image).array = puVar11;
        (this->super_Fl_RGB_Image).alloc_array = 1;
        iVar6 = Fl_Image::h((Fl_Image *)this);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)iVar6;
        uVar12 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar12 = 0xffffffffffffffff;
        }
        png_mem_data.last = (uchar *)operator_new__(uVar12);
        for (fp._0_4_ = 0; iVar6 = (int)fp, iVar8 = Fl_Image::h((Fl_Image *)this), iVar7 = (int)fp,
            iVar6 < iVar8; fp._0_4_ = (int)fp + 1) {
          puVar11 = (this->super_Fl_RGB_Image).array;
          iVar6 = Fl_Image::w((Fl_Image *)this);
          iVar8 = Fl_Image::d((Fl_Image *)this);
          *(uchar **)(png_mem_data.last + (long)(int)fp * 8) = puVar11 + iVar7 * iVar6 * iVar8;
        }
        for (fp._0_4_ = png_set_interlace_handling(info); ppVar3 = info, puVar2 = png_mem_data.last,
            0 < (int)fp; fp._0_4_ = (int)fp + -1) {
          iVar6 = Fl_Image::h((Fl_Image *)this);
          png_read_rows(ppVar3,puVar2,0,iVar6);
        }
        if (png_mem_data.last != (uchar *)0x0) {
          operator_delete__(png_mem_data.last);
        }
        png_read_end(info,rows);
        png_destroy_read_struct(&info,&rows,0);
        if (display_name._4_4_ == 0) {
          fclose(pFStack_30);
        }
        else {
          iVar6 = Fl_Image::w((Fl_Image *)this);
          if (((iVar6 != 0) && (iVar6 = Fl_Image::h((Fl_Image *)this), iVar6 != 0)) &&
             (buffer_png_local != (uchar *)0x0)) {
            this_00 = (Fl_Shared_Image *)operator_new(0x48);
            Fl_Shared_Image::Fl_Shared_Image(this_00,(char *)buffer_png_local,(Fl_Image *)this);
            Fl_Shared_Image::add(this_00);
          }
        }
      }
      else {
        png_destroy_read_struct(&info,&rows,0);
        if (display_name._4_4_ == 0) {
          fclose(pFStack_30);
        }
        (*Fl::warning)("PNG file or data \"%s\" is too large or contains errors!\n");
        Fl_Image::w((Fl_Image *)this,0);
        Fl_Image::h((Fl_Image *)this,0);
        Fl_Image::d((Fl_Image *)this,0);
        Fl_Image::ld((Fl_Image *)this,-3);
      }
    }
  }
  return;
}

Assistant:

void Fl_PNG_Image::load_png_(const char *name_png, const unsigned char *buffer_png, int maxsize)
{
#if defined(HAVE_LIBPNG) && defined(HAVE_LIBZ)
  int i;	  // Looping var
  FILE *fp = NULL;	  // File pointer
  int channels;	  // Number of color channels
  png_structp pp; // PNG read pointer
  png_infop info = 0; // PNG info pointers
  png_bytep *rows;// PNG row pointers
  fl_png_memory png_mem_data;
  int from_memory = (buffer_png != NULL); // true if reading image from memory

  if (!from_memory) {
    if ((fp = fl_fopen(name_png, "rb")) == NULL) {
      ld(ERR_FILE_ACCESS);
      return;
    }
  }
  const char *display_name = (name_png ? name_png : "In-memory PNG data");

  // Setup the PNG data structures...
  pp = png_create_read_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
  if (pp) info = png_create_info_struct(pp);
  if (!pp || !info) {
    if (pp) png_destroy_read_struct(&pp, NULL, NULL);
    if (!from_memory) fclose(fp);
    Fl::warning("Cannot allocate memory to read PNG file or data \"%s\".\n", display_name);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }
  
  if (setjmp(png_jmpbuf(pp)))
  {
    png_destroy_read_struct(&pp, &info, NULL);
    if (!from_memory) fclose(fp);
    Fl::warning("PNG file or data \"%s\" is too large or contains errors!\n", display_name);
    w(0); h(0); d(0); ld(ERR_FORMAT);
    return;
  }

  if (from_memory) {
    png_mem_data.current = buffer_png;
    png_mem_data.last = buffer_png + maxsize;
    png_mem_data.pp = pp;
    // Initialize the function pointer to the PNG read "engine"...
    png_set_read_fn (pp, (png_voidp) &png_mem_data, png_read_data_from_mem);
  } else {
    png_init_io(pp, fp); // Initialize the PNG file read "engine"...
  }  

  // Get the image dimensions and convert to grayscale or RGB...
  png_read_info(pp, info);

  if (png_get_color_type(pp, info) == PNG_COLOR_TYPE_PALETTE)
    png_set_expand(pp);

  if (png_get_color_type(pp, info) & PNG_COLOR_MASK_COLOR)
    channels = 3;
  else
    channels = 1;

  int num_trans = 0;
  png_get_tRNS(pp, info, 0, &num_trans, 0);
  if ((png_get_color_type(pp, info) & PNG_COLOR_MASK_ALPHA) || (num_trans != 0))
    channels ++;

  w((int)(png_get_image_width(pp, info)));
  h((int)(png_get_image_height(pp, info)));
  d(channels);

  if (png_get_bit_depth(pp, info) < 8)
  {
    png_set_packing(pp);
    png_set_expand(pp);
  }
  else if (png_get_bit_depth(pp, info) == 16)
    png_set_strip_16(pp);

#  if defined(HAVE_PNG_GET_VALID) && defined(HAVE_PNG_SET_TRNS_TO_ALPHA)
  // Handle transparency...
  if (png_get_valid(pp, info, PNG_INFO_tRNS))
    png_set_tRNS_to_alpha(pp);
#  endif // HAVE_PNG_GET_VALID && HAVE_PNG_SET_TRNS_TO_ALPHA

  if (((size_t)w()) * h() * d() > max_size() ) longjmp(png_jmpbuf(pp), 1);
  array = new uchar[w() * h() * d()];
  alloc_array = 1;

  // Allocate pointers...
  rows = new png_bytep[h()];

  for (i = 0; i < h(); i ++)
    rows[i] = (png_bytep)(array + i * w() * d());

  // Read the image, handling interlacing as needed...
  for (i = png_set_interlace_handling(pp); i > 0; i --)
    png_read_rows(pp, rows, NULL, h());

#ifdef WIN32
  // Some Windows graphics drivers don't honor transparency when RGB == white
  if (channels == 4) {
    // Convert RGB to 0 when alpha == 0...
    uchar *ptr = (uchar *)array;
    for (i = w() * h(); i > 0; i --, ptr += 4)
      if (!ptr[3]) ptr[0] = ptr[1] = ptr[2] = 0;
  }
#endif // WIN32

  // Free memory and return...
  delete[] rows;

  png_read_end(pp, info);
  png_destroy_read_struct(&pp, &info, NULL);

  if (from_memory) {
    if (w() && h() && name_png) {
      Fl_Shared_Image *si = new Fl_Shared_Image(name_png, this);
      si->add();
    }
  } else {
    fclose(fp);
  }
#endif // HAVE_LIBPNG && HAVE_LIBZ
}